

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

QString * __thiscall
QAccessibleWidget::text(QString *__return_storage_ptr__,QAccessibleWidget *this,Text t)

{
  int iVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  QWidget *pQVar6;
  QWidget *pQVar7;
  long lVar8;
  QWindow *pQVar9;
  long *plVar10;
  long lVar11;
  QTypedArrayData<char16_t> *tmp;
  char16_t *tmp_1;
  long in_FS_OFFSET;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(t) {
  case Name:
    if ((this->d->name).d.size != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QString::operator=(__return_storage_ptr__,(QString *)&this->d->name);
        return __return_storage_ptr__;
      }
      goto LAB_0051aaae;
    }
    pQVar7 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar6 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0) {
      pQVar6 = pQVar7;
    }
    QWidget::accessibleName(&local_58,pQVar6);
    qVar3 = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (qVar3 == 0) {
      lVar8 = (**(code **)(*(long *)this + 0x18))(this);
      lVar11 = 0;
      if ((*(byte *)(*(long *)(lVar8 + 8) + 0x30) & 1) != 0) {
        lVar11 = lVar8;
      }
      if ((*(byte *)(*(long *)(lVar11 + 0x20) + 0xc) & 1) == 0) {
        pQVar6 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
        if (pQVar6 == (QWidget *)0x0) {
          pQVar7 = (QWidget *)0x0;
        }
        else {
          pQVar7 = (QWidget *)0x0;
          if ((*(byte *)(*(long *)&pQVar6->field_0x8 + 0x30) & 1) != 0) {
            pQVar7 = pQVar6;
          }
        }
        buddyString(&local_70,pQVar7);
        qt_accStripAmp(&local_58,&local_70);
        pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        pcVar2 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = local_58.d.d;
        (__return_storage_ptr__->d).ptr = local_58.d.ptr;
        qVar3 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_58.d.size;
        local_58.d.d = (Data *)pQVar4;
        local_58.d.ptr = pcVar2;
        local_58.d.size = qVar3;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
        goto LAB_0051a970;
      }
      pQVar7 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
      pQVar6 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0) {
        pQVar6 = pQVar7;
      }
      pQVar9 = QWidget::windowHandle(pQVar6);
      if ((pQVar9 == (QWindow *)0x0) ||
         (plVar10 = (long *)QWindow::handle(), plVar10 == (long *)0x0)) break;
      (**(code **)(*plVar10 + 0x80))(&local_58,plVar10);
    }
    else {
      pQVar7 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
      pQVar6 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0) {
        pQVar6 = pQVar7;
      }
      QWidget::accessibleName(&local_58,pQVar6);
    }
    local_70.d.d = (__return_storage_ptr__->d).d;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.d = local_70.d.d;
    local_58.d.ptr = pcVar2;
    local_58.d.size = qVar3;
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
joined_r0x0051a81e:
      if (iVar1 == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    break;
  case Description:
    pQVar6 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    if ((*(byte *)(*(long *)&pQVar6->field_0x8 + 0x30) & 1) == 0) {
      pQVar6 = (QWidget *)0x0;
    }
    QWidget::accessibleDescription(&local_58,pQVar6);
    pcVar2 = local_58.d.ptr;
    pDVar5 = local_58.d.d;
    (__return_storage_ptr__->d).d = local_58.d.d;
    local_58.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.d.size;
    if (local_58.d.size == 0) {
      pQVar7 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
      pQVar6 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0) {
        pQVar6 = pQVar7;
      }
      QWidget::toolTip(&local_58,pQVar6);
      (__return_storage_ptr__->d).d = local_58.d.d;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      (__return_storage_ptr__->d).size = local_58.d.size;
      local_58.d.size = 0;
      local_58.d.d = pDVar5;
      local_58.d.ptr = pcVar2;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        local_70.d.d = pDVar5;
        goto joined_r0x0051a81e;
      }
    }
    break;
  case Help:
    pQVar7 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar6 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0) {
      pQVar6 = pQVar7;
    }
    QWidget::whatsThis(&local_58,pQVar6);
    goto LAB_0051a872;
  case Accelerator:
    pQVar6 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    if (pQVar6 == (QWidget *)0x0) {
      pQVar7 = (QWidget *)0x0;
    }
    else {
      pQVar7 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar6->field_0x8 + 0x30) & 1) != 0) {
        pQVar7 = pQVar6;
      }
    }
    buddyString(&local_70,pQVar7);
    qt_accHotKey(&local_58,&local_70);
    pDVar5 = local_58.d.d;
    local_58.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.size = 0;
LAB_0051a970:
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      goto joined_r0x0051a81e;
    }
    break;
  case Identifier:
    pQVar7 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar6 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0) {
      pQVar6 = pQVar7;
    }
    QWidget::accessibleIdentifier(&local_58,pQVar6);
LAB_0051a872:
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    (__return_storage_ptr__->d).size = local_58.d.size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0051aaae:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleWidget::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        if (!d->name.isEmpty()) {
            str = d->name;
        } else if (!widget()->accessibleName().isEmpty()) {
            str = widget()->accessibleName();
        } else if (widget()->isWindow()) {
            if (QWindow *window = widget()->windowHandle()) {
                if (QPlatformWindow *platformWindow = window->handle())
                    str = platformWindow->windowTitle();
            }
        } else {
            str = qt_accStripAmp(buddyString(widget()));
        }
        break;
    case QAccessible::Description:
        str = widget()->accessibleDescription();
#if QT_CONFIG(tooltip)
        if (str.isEmpty())
            str = widget()->toolTip();
#endif
        break;
    case QAccessible::Identifier:
        str = widget()->accessibleIdentifier();
        break;
    case QAccessible::Help:
#if QT_CONFIG(whatsthis)
        str = widget()->whatsThis();
#endif
        break;
    case QAccessible::Accelerator:
        str = qt_accHotKey(buddyString(widget()));
        break;
    case QAccessible::Value:
        break;
    default:
        break;
    }
    return str;
}